

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

void dump_regressor(vw *all,string *reg_name,bool as_text)

{
  size_t __n;
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  vw_exception *this;
  long *plVar4;
  bool bVar5;
  string start_name;
  stringstream __msg;
  io_buf io_temp;
  long *local_2a0;
  long local_290;
  long lStack_288;
  string local_280;
  ostream *local_260;
  size_t local_258;
  ostream local_250;
  io_buf local_d8;
  
  local_260 = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  poVar3 = local_260;
  __n = reg_name->_M_string_length;
  if (__n == local_258) {
    if (__n == 0) {
      bVar5 = true;
    }
    else {
      iVar1 = bcmp((reg_name->_M_dataplus)._M_p,local_260,__n);
      bVar5 = iVar1 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (poVar3 != &local_250) {
    operator_delete(poVar3);
  }
  if (!bVar5) {
    local_260 = &local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,".writing","");
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_260,0,(char *)0x0,(ulong)(reg_name->_M_dataplus)._M_p)
    ;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_290 = *plVar4;
      lStack_288 = plVar2[3];
      local_2a0 = &local_290;
    }
    else {
      local_290 = *plVar4;
      local_2a0 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_260 != &local_250) {
      operator_delete(local_260);
    }
    local_d8._vptr_io_buf = (_func_int **)&PTR_open_file_002d6080;
    local_d8.space._begin = (char *)0x0;
    local_d8.space._end = (char *)0x0;
    local_d8.space.end_array = (char *)0x0;
    local_d8.space.erase_count = 0;
    local_d8.files._begin = (int *)0x0;
    local_d8.files._end = (int *)0x0;
    local_d8.files.end_array = (int *)0x0;
    local_d8.files.erase_count = 0;
    local_d8.currentname._begin = (char *)0x0;
    local_d8.currentname._end = (char *)0x0;
    local_d8.currentname.end_array = (char *)0x0;
    local_d8.currentname.erase_count = 0;
    local_d8.finalname._begin = (char *)0x0;
    local_d8.finalname._end = (char *)0x0;
    local_d8.finalname.end_array = (char *)0x0;
    local_d8.finalname.erase_count = 0;
    v_array<char>::resize(&local_d8.space,0x10000);
    local_d8.count = 0;
    local_d8.current = 0;
    local_d8.head = local_d8.space._begin;
    local_d8._verify_hash = false;
    local_d8._hash = 0;
    io_buf::open_file(&local_d8,(char *)local_2a0,all->stdin_off,2);
    dump_regressor(all,&local_d8,as_text);
    remove((reg_name->_M_dataplus)._M_p);
    iVar1 = rename((char *)local_2a0,(reg_name->_M_dataplus)._M_p);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_250,
                 "WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: ",
                 0x4d);
      poVar3 = std::operator<<(&local_250,(char *)local_2a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," to ",4);
      std::operator<<(poVar3,(reg_name->_M_dataplus)._M_p);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                 ,0x237,&local_280);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    io_buf::~io_buf(&local_d8);
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0);
    }
  }
  return;
}

Assistant:

void dump_regressor(vw& all, string reg_name, bool as_text)
{
  if (reg_name == string(""))
    return;
  string start_name = reg_name + string(".writing");
  io_buf io_temp;

  io_temp.open_file(start_name.c_str(), all.stdin_off, io_buf::WRITE);

  dump_regressor(all, io_temp, as_text);

  remove(reg_name.c_str());

  if (0 != rename(start_name.c_str(), reg_name.c_str()))
    THROW("WARN: dump_regressor(vw& all, string reg_name, bool as_text): cannot rename: "
        << start_name.c_str() << " to " << reg_name.c_str());
}